

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

int ConvexDecomposition::maxdirsterid<ConvexDecomposition::float3>
              (float3 *p,int count,float3 *dir,Array<int> *allow)

{
  undefined1 auVar1 [16];
  Array<int> *allow_00;
  int i;
  int iVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  float fVar15;
  float fVar16;
  float3 fVar17;
  float3 fVar18;
  float3 local_a0;
  float3 local_90;
  float local_84;
  Array<int> *local_80;
  float3 local_78;
  float local_68;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  undefined1 auVar14 [56];
  
  local_80 = allow;
  do {
    auVar14 = in_ZMM0._8_56_;
    i = maxdirfiltered<ConvexDecomposition::float3>(p,count,dir,allow);
    piVar4 = Array<int>::operator[](allow,i);
    if (*piVar4 == 3) {
      return i;
    }
    fVar17 = orth(dir);
    fVar15 = fVar17.z;
    auVar10._0_8_ = fVar17._0_8_;
    auVar10._8_56_ = auVar14;
    _local_48 = auVar10._0_16_;
    local_78._0_8_ = vmovlps_avx(_local_48);
    local_78.z = fVar15;
    fVar17 = cross(&local_78,dir);
    auVar11._0_8_ = fVar17._0_8_;
    auVar11._8_56_ = auVar14;
    _local_58 = auVar11._0_16_;
    iVar5 = -1;
    for (fVar16 = 0.0; allow = local_80, in_ZMM0 = ZEXT464(0x43b40000), fVar16 <= 360.0;
        fVar16 = fVar16 + 45.0) {
      local_68 = sinf(fVar16 * 0.017453292);
      fVar7 = cosf(fVar16 * 0.017453292);
      local_a0.z = (local_68 * fVar15 + fVar7 * fVar17.z) * 0.025;
      auVar8._0_4_ = fVar7 * (float)local_58._0_4_ + local_68 * (float)local_48._0_4_;
      auVar8._4_4_ = fVar7 * (float)local_58._4_4_ + local_68 * (float)local_48._4_4_;
      auVar8._8_4_ = fVar7 * fStack_50 + local_68 * fStack_40;
      auVar8._12_4_ = fVar7 * fStack_4c + local_68 * fStack_3c;
      auVar6._8_4_ = 0x3ccccccd;
      auVar6._0_8_ = 0x3ccccccd3ccccccd;
      auVar6._12_4_ = 0x3ccccccd;
      auVar6 = vmulps_avx512vl(auVar8,auVar6);
      auVar14 = ZEXT856(auVar6._8_8_);
      local_a0._0_8_ = vmovlps_avx(auVar6);
      fVar18 = operator+(dir,&local_a0);
      allow_00 = local_80;
      local_90.z = fVar18.z;
      auVar12._0_8_ = fVar18._0_8_;
      auVar12._8_56_ = auVar14;
      local_90._0_8_ = vmovlps_avx(auVar12._0_16_);
      iVar2 = maxdirfiltered<ConvexDecomposition::float3>(p,count,&local_90,local_80);
      if (iVar2 == i && iVar5 == i) {
LAB_00e2cc1b:
        piVar4 = Array<int>::operator[](allow_00,i);
        *piVar4 = 3;
        return i;
      }
      if (iVar5 != iVar2 && iVar5 != -1) {
        fVar7 = fVar16 + -40.0;
        while (fVar7 <= fVar16) {
          local_84 = fVar7;
          local_68 = sinf(fVar7 * 0.017453292);
          fVar7 = cosf(fVar7 * 0.017453292);
          local_a0.z = (local_68 * fVar15 + fVar7 * fVar17.z) * 0.025;
          auVar9._0_4_ = local_68 * (float)local_48._0_4_ + fVar7 * (float)local_58._0_4_;
          auVar9._4_4_ = local_68 * (float)local_48._4_4_ + fVar7 * (float)local_58._4_4_;
          auVar9._8_4_ = local_68 * fStack_40 + fVar7 * fStack_50;
          auVar9._12_4_ = local_68 * fStack_3c + fVar7 * fStack_4c;
          auVar1._8_4_ = 0x3ccccccd;
          auVar1._0_8_ = 0x3ccccccd3ccccccd;
          auVar1._12_4_ = 0x3ccccccd;
          auVar6 = vmulps_avx512vl(auVar9,auVar1);
          auVar14 = ZEXT856(auVar6._8_8_);
          local_a0._0_8_ = vmovlps_avx(auVar6);
          fVar18 = operator+(dir,&local_a0);
          local_90.z = fVar18.z;
          auVar13._0_8_ = fVar18._0_8_;
          auVar13._8_56_ = auVar14;
          local_90._0_8_ = vmovlps_avx(auVar13._0_16_);
          iVar3 = maxdirfiltered<ConvexDecomposition::float3>(p,count,&local_90,allow_00);
          if (iVar3 == i && iVar5 == i) goto LAB_00e2cc1b;
          iVar5 = iVar3;
          fVar7 = local_84 + 5.0;
        }
      }
      iVar5 = iVar2;
    }
    piVar4 = Array<int>::operator[](local_80,i);
    *piVar4 = 0;
  } while( true );
}

Assistant:

int maxdirsterid(const T *p,int count,const T &dir,Array<int> &allow)
{
	int m=-1;
	while(m==-1)
	{
		m = maxdirfiltered(p,count,dir,allow);
		if(allow[m]==3) return m;
		T u = orth(dir);
		T v = cross(u,dir);
		int ma=-1;
		for(float x = 0.0f ; x<= 360.0f ; x+= 45.0f)
		{
			float s = sinf(DEG2RAD*(x));
			float c = cosf(DEG2RAD*(x));
			int mb = maxdirfiltered(p,count,dir+(u*s+v*c)*0.025f,allow);
			if(ma==m && mb==m)
			{
				allow[m]=3;
				return m;
			}
			if(ma!=-1 && ma!=mb)  // Yuck - this is really ugly
			{
				int mc = ma;
				for(float xx = x-40.0f ; xx <= x ; xx+= 5.0f)
				{
					float s = sinf(DEG2RAD*(xx));
					float c = cosf(DEG2RAD*(xx));
					int md = maxdirfiltered(p,count,dir+(u*s+v*c)*0.025f,allow);
					if(mc==m && md==m)
					{
						allow[m]=3;
						return m;
					}
					mc=md;
				}
			}
			ma=mb;
		}
		allow[m]=0;
		m=-1;
	}
	assert(0);
	return m;
}